

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  CodedOutputStream *this;
  uint32 uVar1;
  ulong uVar2;
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  CodedOutputStream *local_30;
  CodedOutputStream *output_local;
  string *value_local;
  CodedOutputStream *pCStack_18;
  int field_number_local;
  undefined4 local_10;
  int local_c;
  
  local_10 = 2;
  local_30 = output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  pCStack_18 = output;
  local_c = field_number;
  uVar1 = MakeTag(field_number,WIRETYPE_LENGTH_DELIMITED);
  io::CodedOutputStream::WriteTag(output,uVar1);
  uVar2 = std::__cxx11::string::size();
  local_69 = 0;
  if (0x7fffffff < uVar2) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x123);
    local_69 = 1;
    other = LogMessage::operator<<(&local_68,"CHECK failed: value.size() <= kint32max: ");
    LogFinisher::operator=(local_7d,other);
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage(&local_68);
  }
  this = local_30;
  uVar1 = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32(this,uVar1);
  io::CodedOutputStream::WriteString(local_30,(string *)output_local);
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK(value.size() <= kint32max);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}